

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCUtil.cpp
# Opt level: O0

void __thiscall Assimp::IFC::TempMesh::Append(TempMesh *this,TempMesh *other)

{
  const_iterator __first;
  const_iterator __last;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_50;
  const_iterator local_48;
  aiVector3t<double> *local_40;
  aiVector3t<double> *local_38;
  __normal_iterator<const_aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
  local_30;
  __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
  local_28;
  const_iterator local_20;
  TempMesh *local_18;
  TempMesh *other_local;
  TempMesh *this_local;
  
  local_18 = other;
  other_local = this;
  local_28._M_current =
       (aiVector3t<double> *)
       std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::end(&this->mVerts);
  __gnu_cxx::
  __normal_iterator<aiVector3t<double>const*,std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>>
  ::__normal_iterator<aiVector3t<double>*>
            ((__normal_iterator<aiVector3t<double>const*,std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>>
              *)&local_20,&local_28);
  local_30._M_current =
       (aiVector3t<double> *)
       std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::begin
                 (&local_18->mVerts);
  local_38 = (aiVector3t<double> *)
             std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::end
                       (&local_18->mVerts);
  local_40 = (aiVector3t<double> *)
             std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
             insert<__gnu_cxx::__normal_iterator<aiVector3t<double>const*,std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>>,void>
                       ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)this,
                        local_20,local_30,
                        (__normal_iterator<const_aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                         )local_38);
  local_50._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(&this->mVertcnt);
  __gnu_cxx::
  __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>::
  __normal_iterator<unsigned_int*>
            ((__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
              *)&local_48,&local_50);
  __first = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(&local_18->mVertcnt);
  __last = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(&local_18->mVertcnt);
  std::vector<unsigned_int,std::allocator<unsigned_int>>::
  insert<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&this->mVertcnt,local_48,
             (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )__first._M_current,
             (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )__last._M_current);
  return;
}

Assistant:

void TempMesh::Append(const TempMesh& other)
{
    mVerts.insert(mVerts.end(),other.mVerts.begin(),other.mVerts.end());
    mVertcnt.insert(mVertcnt.end(),other.mVertcnt.begin(),other.mVertcnt.end());
}